

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void vdbeMergeEngineCompare(MergeEngine *pMerger,int iOut)

{
  int iVar1;
  int in_ESI;
  int *in_RDI;
  int res;
  int bCached;
  SortSubtask *pTask;
  PmaReader *p2;
  PmaReader *p1;
  int iRes;
  int i2;
  int i1;
  undefined4 local_34;
  long local_30;
  long local_28;
  long local_20;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  int *local_8;
  
  if (in_ESI < *in_RDI / 2) {
    local_10 = *(int *)(*(long *)(in_RDI + 4) + (long)(in_ESI << 1) * 4);
    local_14 = *(int *)(*(long *)(in_RDI + 4) + (long)(in_ESI * 2 + 1) * 4);
  }
  else {
    local_10 = (in_ESI - *in_RDI / 2) * 2;
    local_14 = local_10 + 1;
  }
  local_20 = *(long *)(in_RDI + 6) + (long)local_10 * 0x50;
  local_28 = *(long *)(in_RDI + 6) + (long)local_14 * 0x50;
  local_c = in_ESI;
  local_8 = in_RDI;
  if (*(long *)(local_20 + 0x18) == 0) {
    local_18 = local_14;
  }
  else if (*(long *)(local_28 + 0x18) == 0) {
    local_18 = local_10;
  }
  else {
    local_30 = *(long *)(in_RDI + 2);
    local_34 = 0;
    iVar1 = (**(code **)(local_30 + 0x40))
                      (local_30,&local_34,*(undefined8 *)(local_20 + 0x28),
                       *(undefined4 *)(local_20 + 0x14),*(undefined8 *)(local_28 + 0x28),
                       *(undefined4 *)(local_28 + 0x14));
    if (iVar1 < 1) {
      local_18 = local_10;
    }
    else {
      local_18 = local_14;
    }
  }
  *(int *)(*(long *)(local_8 + 4) + (long)local_c * 4) = local_18;
  return;
}

Assistant:

static void vdbeMergeEngineCompare(
  MergeEngine *pMerger,  /* Merge engine containing PmaReaders to compare */
  int iOut               /* Store the result in pMerger->aTree[iOut] */
){
  int i1;
  int i2;
  int iRes;
  PmaReader *p1;
  PmaReader *p2;

  assert( iOut<pMerger->nTree && iOut>0 );

  if( iOut>=(pMerger->nTree/2) ){
    i1 = (iOut - pMerger->nTree/2) * 2;
    i2 = i1 + 1;
  }else{
    i1 = pMerger->aTree[iOut*2];
    i2 = pMerger->aTree[iOut*2+1];
  }

  p1 = &pMerger->aReadr[i1];
  p2 = &pMerger->aReadr[i2];

  if( p1->pFd==0 ){
    iRes = i2;
  }else if( p2->pFd==0 ){
    iRes = i1;
  }else{
    SortSubtask *pTask = pMerger->pTask;
    int bCached = 0;
    int res;
    assert( pTask->pUnpacked!=0 );  /* from vdbeSortSubtaskMain() */
    res = pTask->xCompare(
        pTask, &bCached, p1->aKey, p1->nKey, p2->aKey, p2->nKey
    );
    if( res<=0 ){
      iRes = i1;
    }else{
      iRes = i2;
    }
  }

  pMerger->aTree[iOut] = iRes;
}